

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_avx2.c
# Opt level: O0

void highbd_inv_txfm2d_add_no_identity_avx2
               (int32_t *input,uint16_t *output,int stride,TX_TYPE tx_type,TX_SIZE tx_size,int eob,
               int bd)

{
  byte in_CL;
  long in_RDI;
  byte in_R8B;
  int in_R9D;
  int i_2;
  int i_1;
  int j;
  __m256i *_buf1;
  __m256i buf0 [64];
  int i;
  int lr_flip;
  int ud_flip;
  transform_1d_avx2_conflict col_txfm;
  transform_1d_avx2_conflict row_txfm;
  int fun_idx_y;
  int fun_idx_x;
  int rect_type;
  int input_stride;
  int buf_size_nonzero_h_div8;
  int buf_size_nonzero_w;
  int buf_size_w_div8;
  int txfm_size_row;
  int txfm_size_col;
  int txh_idx;
  int txw_idx;
  int8_t *shift;
  int eoby;
  int eobx;
  __m256i buf1 [512];
  int local_48dc;
  int local_48d8;
  int local_48d4;
  int local_48d0;
  int local_48cc;
  longlong *in_stack_ffffffffffffb738;
  __m256i *in_stack_ffffffffffffb740;
  __m256i *in_stack_ffffffffffffb748;
  int in_stack_ffffffffffffb790;
  int in_stack_ffffffffffffb794;
  int in_stack_ffffffffffffb798;
  int in_stack_ffffffffffffb79c;
  uint16_t *in_stack_ffffffffffffb7a0;
  int in_stack_ffffffffffffb7a8;
  int in_stack_ffffffffffffb7ac;
  int in_stack_ffffffffffffb7b0;
  int in_stack_ffffffffffffb7b4;
  uint16_t *in_stack_ffffffffffffb7b8;
  __m256i *in_stack_ffffffffffffb7c0;
  int in_stack_ffffffffffffb834;
  int in_stack_ffffffffffffb838;
  int in_stack_ffffffffffffb83c;
  __m256i *in_stack_ffffffffffffb840;
  __m256i *in_stack_ffffffffffffb848;
  __m256i *in_stack_ffffffffffffb868;
  __m256i *in_stack_ffffffffffffb870;
  int local_40bc;
  int local_40b8;
  int local_40b4;
  transform_1d_avx2_conflict local_40b0;
  transform_1d_avx2_conflict local_40a8;
  int local_409c;
  int local_4098;
  int local_4094;
  int local_4090;
  int local_408c;
  int local_4088;
  int local_4084;
  int local_4080;
  int local_407c;
  int local_4078;
  int local_4074;
  char *local_4070;
  int local_4068;
  int local_4064;
  longlong local_4060 [2051];
  byte local_46;
  byte local_45;
  long local_38;
  
  local_46 = in_R8B;
  local_45 = in_CL;
  local_38 = in_RDI;
  get_eobx_eoby_scan_default(&local_4064,&local_4068,in_R8B,in_R9D);
  local_4070 = av1_inv_txfm_shift_ls[local_46];
  local_4074 = get_txw_idx(local_46);
  local_4078 = get_txh_idx(local_46);
  local_407c = tx_size_wide[local_46];
  local_4080 = tx_size_high[local_46];
  local_4084 = local_407c >> 3;
  local_4088 = (local_4064 + 8 >> 3) << 3;
  local_408c = local_4068 + 8 >> 3;
  local_48dc = local_4080;
  if (0x20 < local_4080) {
    local_48dc = 0x20;
  }
  local_4090 = local_48dc;
  local_4094 = get_rect_tx_log_ratio(local_407c,local_4080);
  local_4098 = lowbd_txfm_all_1d_zeros_idx[local_4064];
  local_409c = lowbd_txfm_all_1d_zeros_idx[local_4068];
  local_40a8 = highbd_txfm_all_1d_zeros_w8_arr[local_4074][""[local_45]][local_4098];
  local_40b0 = highbd_txfm_all_1d_zeros_w8_arr[local_4078][""[local_45]][local_409c];
  get_flip_cfg(local_45,&local_40b4,&local_40b8);
  for (local_40bc = 0; local_40bc < local_408c; local_40bc = local_40bc + 1) {
    load_buffer_32bit_input
              ((int32_t *)(local_38 + (long)(local_40bc << 3) * 4),local_4090,
               (__m256i *)&stack0xffffffffffffb740,local_4088);
    if ((local_4094 == 1) || (local_4094 == -1)) {
      round_shift_rect_array_32_avx2
                (in_stack_ffffffffffffb848,in_stack_ffffffffffffb840,in_stack_ffffffffffffb83c,
                 in_stack_ffffffffffffb838,in_stack_ffffffffffffb834);
    }
    (*local_40a8)((__m256i *)&stack0xffffffffffffb740,(__m256i *)&stack0xffffffffffffb740,0xc,0,i_2,
                  -(int)*local_4070);
    in_stack_ffffffffffffb738 = local_4060 + (long)(local_40bc << 3) * 4;
    if (local_40b8 == 0) {
      for (local_48d0 = 0; local_48d0 < local_4084; local_48d0 = local_48d0 + 1) {
        transpose_8x8_avx2(in_stack_ffffffffffffb870,in_stack_ffffffffffffb868);
      }
    }
    else {
      for (local_48cc = 0; local_48cc < local_4084; local_48cc = local_48cc + 1) {
        transpose_8x8_flip_avx2(in_stack_ffffffffffffb870,in_stack_ffffffffffffb868);
      }
    }
  }
  for (local_48d4 = 0; local_48d4 < local_4084; local_48d4 = local_48d4 + 1) {
    (*local_40b0)((__m256i *)(local_4060 + (long)(local_48d4 * local_4080) * 4),
                  (__m256i *)(local_4060 + (long)(local_48d4 * local_4080) * 4),0xc,1,i_2,0);
    round_shift_array_32_avx2
              (in_stack_ffffffffffffb748,in_stack_ffffffffffffb740,
               (int)((ulong)in_stack_ffffffffffffb738 >> 0x20),(int)in_stack_ffffffffffffb738);
  }
  if (local_407c < 0x10) {
    if (local_407c == 8) {
      highbd_write_buffer_8xn_avx2
                (in_stack_ffffffffffffb7c0,in_stack_ffffffffffffb7b8,in_stack_ffffffffffffb7b4,
                 in_stack_ffffffffffffb7b0,in_stack_ffffffffffffb7ac,in_stack_ffffffffffffb7a8);
    }
  }
  else {
    for (local_48d8 = 0; local_48d8 < local_407c >> 4; local_48d8 = local_48d8 + 1) {
      highbd_write_buffer_16xn_avx2
                ((__m256i *)CONCAT44(in_stack_ffffffffffffb7ac,in_stack_ffffffffffffb7a8),
                 in_stack_ffffffffffffb7a0,in_stack_ffffffffffffb79c,in_stack_ffffffffffffb798,
                 in_stack_ffffffffffffb794,in_stack_ffffffffffffb790);
    }
  }
  return;
}

Assistant:

static void highbd_inv_txfm2d_add_no_identity_avx2(const int32_t *input,
                                                   uint16_t *output, int stride,
                                                   TX_TYPE tx_type,
                                                   TX_SIZE tx_size, int eob,
                                                   const int bd) {
  __m256i buf1[64 * 8];
  int eobx, eoby;
  get_eobx_eoby_scan_default(&eobx, &eoby, tx_size, eob);
  const int8_t *shift = av1_inv_txfm_shift_ls[tx_size];
  const int txw_idx = get_txw_idx(tx_size);
  const int txh_idx = get_txh_idx(tx_size);
  const int txfm_size_col = tx_size_wide[tx_size];
  const int txfm_size_row = tx_size_high[tx_size];
  const int buf_size_w_div8 = txfm_size_col >> 3;
  const int buf_size_nonzero_w = (eobx + 8) >> 3 << 3;
  const int buf_size_nonzero_h_div8 = (eoby + 8) >> 3;
  const int input_stride = AOMMIN(32, txfm_size_row);
  const int rect_type = get_rect_tx_log_ratio(txfm_size_col, txfm_size_row);
  const int fun_idx_x = lowbd_txfm_all_1d_zeros_idx[eobx];
  const int fun_idx_y = lowbd_txfm_all_1d_zeros_idx[eoby];
  const transform_1d_avx2 row_txfm =
      highbd_txfm_all_1d_zeros_w8_arr[txw_idx][hitx_1d_tab[tx_type]][fun_idx_x];
  const transform_1d_avx2 col_txfm =
      highbd_txfm_all_1d_zeros_w8_arr[txh_idx][vitx_1d_tab[tx_type]][fun_idx_y];

  assert(col_txfm != NULL);
  assert(row_txfm != NULL);
  int ud_flip, lr_flip;
  get_flip_cfg(tx_type, &ud_flip, &lr_flip);

  // 1st stage: column transform
  for (int i = 0; i < buf_size_nonzero_h_div8; i++) {
    __m256i buf0[64];
    load_buffer_32bit_input(input + i * 8, input_stride, buf0,
                            buf_size_nonzero_w);
    if (rect_type == 1 || rect_type == -1) {
      round_shift_rect_array_32_avx2(buf0, buf0, buf_size_nonzero_w, 0,
                                     NewInvSqrt2);
    }
    row_txfm(buf0, buf0, INV_COS_BIT, 0, bd, -shift[0]);

    __m256i *_buf1 = buf1 + i * 8;
    if (lr_flip) {
      for (int j = 0; j < buf_size_w_div8; ++j) {
        transpose_8x8_flip_avx2(
            &buf0[j * 8], &_buf1[(buf_size_w_div8 - 1 - j) * txfm_size_row]);
      }
    } else {
      for (int j = 0; j < buf_size_w_div8; ++j) {
        transpose_8x8_avx2(&buf0[j * 8], &_buf1[j * txfm_size_row]);
      }
    }
  }
  // 2nd stage: column transform
  for (int i = 0; i < buf_size_w_div8; i++) {
    col_txfm(buf1 + i * txfm_size_row, buf1 + i * txfm_size_row, INV_COS_BIT, 1,
             bd, 0);

    round_shift_array_32_avx2(buf1 + i * txfm_size_row,
                              buf1 + i * txfm_size_row, txfm_size_row,
                              -shift[1]);
  }

  // write to buffer
  if (txfm_size_col >= 16) {
    for (int i = 0; i < (txfm_size_col >> 4); i++) {
      highbd_write_buffer_16xn_avx2(buf1 + i * txfm_size_row * 2,
                                    output + 16 * i, stride, ud_flip,
                                    txfm_size_row, bd);
    }
  } else if (txfm_size_col == 8) {
    highbd_write_buffer_8xn_avx2(buf1, output, stride, ud_flip, txfm_size_row,
                                 bd);
  }
}